

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::AppendGlobalTargetDepends
          (cmGlobalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmGeneratorTarget *target)

{
  cmGeneratorTarget *this_00;
  TargetType TVar1;
  TargetDependSet *pTVar2;
  cmLocalUnixMakefileGenerator3 *this_01;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  string tgtName;
  string local_50;
  
  pTVar2 = cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,target);
  p_Var3 = (pTVar2->
           super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
           _M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(pTVar2->
            super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
            _M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      this_00 = *(cmGeneratorTarget **)(p_Var3 + 1);
      TVar1 = cmGeneratorTarget::GetType(this_00);
      if (TVar1 != INTERFACE_LIBRARY) {
        this_01 = (cmLocalUnixMakefileGenerator3 *)cmGeneratorTarget::GetLocalGenerator(this_00);
        cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                  (&local_50,this_01,this_00);
        std::__cxx11::string::append((char *)&local_50);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(depends,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::AppendGlobalTargetDepends(
  std::vector<std::string>& depends, cmGeneratorTarget* target)
{
  TargetDependSet const& depends_set = this->GetTargetDirectDepends(target);
  for (TargetDependSet::const_iterator i = depends_set.begin();
       i != depends_set.end(); ++i) {
    // Create the target-level dependency.
    cmGeneratorTarget const* dep = *i;
    if (dep->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    cmLocalUnixMakefileGenerator3* lg3 =
      static_cast<cmLocalUnixMakefileGenerator3*>(dep->GetLocalGenerator());
    std::string tgtName =
      lg3->GetRelativeTargetDirectory(const_cast<cmGeneratorTarget*>(dep));
    tgtName += "/all";
    depends.push_back(tgtName);
  }
}